

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O2

void __thiscall tokenizer::read_number(tokenizer *this)

{
  char *pcVar1;
  
  pcVar1 = this->line_char;
  this->last_line_number = this->line_number;
  this->last_position_number = this->position_number;
  while ((int)*pcVar1 - 0x30U < 10) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->current_word,*pcVar1);
    pcVar1 = this->line_char + 1;
    this->line_char = pcVar1;
    this->position_number = this->position_number + 1;
  }
  add_token_to_stream(this,integer);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&this->current_word,"");
  return;
}

Assistant:

void tokenizer::read_number() {
    last_line_number = line_number;
    last_position_number = position_number;

    while(*line_char != '\0') {
        if(isdigit(*line_char)) {
            current_word += *line_char;
            this->advance_to_next_character();
        }
        else {
            break;
        }
    }

    this->add_token_to_stream(Token_Type::integer);

    //position_number += current_word.length();
    current_word = "";
}